

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O0

c_v128 c_v128_from_32(uint32_t a,uint32_t b,uint32_t c,uint32_t d)

{
  c_v128 cVar1;
  uint32_t d_local;
  uint32_t c_local;
  uint32_t b_local;
  uint32_t a_local;
  c_v128 t;
  
  cVar1.u32[1] = c;
  cVar1.u32[0] = d;
  cVar1.u32[2] = b;
  cVar1.u32[3] = a;
  return cVar1;
}

Assistant:

SIMD_INLINE c_v128 c_v128_from_32(uint32_t a, uint32_t b, uint32_t c,
                                  uint32_t d) {
  c_v128 t;
  t.u32[3] = a;
  t.u32[2] = b;
  t.u32[1] = c;
  t.u32[0] = d;
  return t;
}